

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_walldraw.cpp
# Opt level: O0

void swrenderer::ProcessWallNP2
               (int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,double yrepeat,
               double top,double bot,bool mask)

{
  short sVar1;
  int iVar2;
  double dVar3;
  double __y;
  double dVar4;
  short *local_87b0;
  short *local_87a0;
  int local_8790;
  int j_3;
  int j_2;
  int j_1;
  int j;
  double scaledtexheight;
  double partition;
  double texheight;
  short *down;
  short *up;
  short most3 [5760];
  short most2 [5760];
  short most1 [5760];
  bool mask_local;
  double bot_local;
  double top_local;
  double yrepeat_local;
  fixed_t *lwal_local;
  float *swal_local;
  short *dwal_local;
  short *uwal_local;
  int x2_local;
  int x1_local;
  
  iVar2 = FTexture::GetHeight(rw_pic);
  dVar3 = (double)iVar2;
  __y = dVar3 / yrepeat;
  if (yrepeat < 0.0) {
    dVar4 = fmod((bot - dc_texturemid / yrepeat) - ViewPos.Z,__y);
    scaledtexheight = bot - dVar4;
    down = most2 + 0x167c;
    dc_texturemid = (scaledtexheight - ViewPos.Z) * yrepeat + dVar3;
    texheight = (double)dwal;
    for (; scaledtexheight < top; scaledtexheight = scaledtexheight - __y) {
      iVar2 = R_CreateWallSegmentY((short *)&up,scaledtexheight - ViewPos.Z,(FWallCoords *)&WallC);
      local_8790 = x1;
      if (iVar2 != 0xc) {
        for (; local_8790 < x2; local_8790 = local_8790 + 1) {
          sVar1 = clamp<short>(most3[(long)local_8790 + -4],uwal[local_8790],
                               *(short *)((long)texheight + (long)local_8790 * 2));
          down[local_8790] = sVar1;
        }
        ProcessWall(x1,x2,down,(short *)texheight,swal,lwal,yrepeat,mask);
        texheight = (double)down;
        if (down == most2 + 0x167c) {
          local_87b0 = most3;
        }
        else {
          local_87b0 = most2;
        }
        local_87b0 = local_87b0 + 0x167c;
        down = local_87b0;
      }
      dc_texturemid = dc_texturemid - dVar3;
    }
    ProcessWall(x1,x2,uwal,(short *)texheight,swal,lwal,yrepeat,mask);
  }
  else {
    dVar4 = fmod((top - dc_texturemid / yrepeat) - ViewPos.Z,__y);
    scaledtexheight = top - dVar4;
    if ((scaledtexheight == top) && (!NAN(scaledtexheight) && !NAN(top))) {
      scaledtexheight = scaledtexheight - __y;
    }
    texheight = (double)(most2 + 0x167c);
    dc_texturemid = (scaledtexheight - ViewPos.Z) * yrepeat + dVar3;
    down = uwal;
    for (; bot < scaledtexheight; scaledtexheight = scaledtexheight - __y) {
      iVar2 = R_CreateWallSegmentY((short *)&up,scaledtexheight - ViewPos.Z,(FWallCoords *)&WallC);
      j_3 = x1;
      if (iVar2 != 3) {
        for (; j_3 < x2; j_3 = j_3 + 1) {
          sVar1 = clamp<short>(most3[(long)j_3 + -4],down[j_3],dwal[j_3]);
          *(short *)((long)texheight + (long)j_3 * 2) = sVar1;
        }
        ProcessWall(x1,x2,down,(short *)texheight,swal,lwal,yrepeat,mask);
        down = (short *)texheight;
        if ((short *)texheight == most2 + 0x167c) {
          local_87a0 = most3;
        }
        else {
          local_87a0 = most2;
        }
        local_87a0 = local_87a0 + 0x167c;
        texheight = (double)local_87a0;
      }
      dc_texturemid = dc_texturemid - dVar3;
    }
    ProcessWall(x1,x2,down,dwal,swal,lwal,yrepeat,mask);
  }
  return;
}

Assistant:

static void ProcessWallNP2(int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal, double yrepeat, double top, double bot, bool mask)
{
	short most1[MAXWIDTH], most2[MAXWIDTH], most3[MAXWIDTH];
	short *up, *down;
	double texheight = rw_pic->GetHeight();
	double partition;
	double scaledtexheight = texheight / yrepeat;

	if (yrepeat >= 0)
	{ // normal orientation: draw strips from top to bottom
		partition = top - fmod(top - dc_texturemid / yrepeat - ViewPos.Z, scaledtexheight);
		if (partition == top)
		{
			partition -= scaledtexheight;
		}
		up = uwal;
		down = most1;
		dc_texturemid = (partition - ViewPos.Z) * yrepeat + texheight;
		while (partition > bot)
		{
			int j = R_CreateWallSegmentY(most3, partition - ViewPos.Z, &WallC);
			if (j != 3)
			{
				for (int j = x1; j < x2; ++j)
				{
					down[j] = clamp(most3[j], up[j], dwal[j]);
				}
				ProcessWall(x1, x2, up, down, swal, lwal, yrepeat, mask);
				up = down;
				down = (down == most1) ? most2 : most1;
			}
			partition -= scaledtexheight;
			dc_texturemid -= texheight;
 		}
		ProcessWall(x1, x2, up, dwal, swal, lwal, yrepeat, mask);
	}
	else
	{ // upside down: draw strips from bottom to top
		partition = bot - fmod(bot - dc_texturemid / yrepeat - ViewPos.Z, scaledtexheight);
		up = most1;
		down = dwal;
		dc_texturemid = (partition - ViewPos.Z) * yrepeat + texheight;
		while (partition < top)
		{
			int j = R_CreateWallSegmentY(most3, partition - ViewPos.Z, &WallC);
			if (j != 12)
			{
				for (int j = x1; j < x2; ++j)
				{
					up[j] = clamp(most3[j], uwal[j], down[j]);
				}
				ProcessWall(x1, x2, up, down, swal, lwal, yrepeat, mask);
				down = up;
				up = (up == most1) ? most2 : most1;
			}
			partition -= scaledtexheight;
			dc_texturemid -= texheight;
 		}
		ProcessWall(x1, x2, uwal, down, swal, lwal, yrepeat, mask);
	}
}